

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionGraph::make_rewind_exec
          (InstructionGraph *this,InstructionMark *mark,InstructionRewind *rewind)

{
  PendingRewindTrans *pPVar1;
  uint *puVar2;
  Instruction *pIVar3;
  int iVar4;
  iterator iVar5;
  Instruction *pIVar6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  pointer pTVar10;
  uint *puVar11;
  bool bVar12;
  PendingRewindTrans pt;
  Vec<unsigned_int> keep_ind;
  anon_class_32_4_fc640c73 reg;
  deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  pending_trans;
  map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  instruction_map;
  InstructionMark *local_180;
  Instruction *local_178;
  undefined8 uStack_170;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  Transition local_150;
  Vec<unsigned_int> local_128;
  Vec<unsigned_int> *local_110;
  Vec<unsigned_int> local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  anon_class_32_4_fc640c73 local_d8;
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  local_b8;
  _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_180 = mark;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::_M_initialize_map(&local_b8,0);
  local_d8.instruction_map =
       (map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
        *)&local_60;
  local_d8.mark = &local_180;
  local_d8.this = this;
  local_d8.pending_trans =
       (deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
        *)&local_b8;
  range_vec<unsigned_int>
            (&local_108,
             (uint)((ulong)((long)*(pointer *)
                                   ((long)&(rewind->super_Instruction).cx.pos.
                                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           .
                                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(rewind->super_Instruction).cx.pos.
                                 super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 .
                                 super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
  make_rewind_exec::anon_class_32_4_fc640c73::operator()
            (&local_d8,&rewind->super_Instruction,&local_108);
  if (local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_110 = &(rewind->super_Instruction).cx.paths_to_mark;
    do {
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pPVar1 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_178 = pPVar1[0x1f].new_inst;
        uStack_170._0_4_ = pPVar1[0x1f].num_prev;
        uStack_170._4_4_ = pPVar1[0x1f].num_next;
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_178 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].new_inst;
        uStack_170._0_4_ = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_prev;
        uStack_170._4_4_ = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_next;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar10 = (local_178->orig->prev).
                super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_start + (uStack_170 & 0xffffffff);
      puVar2 = (local_178->orig_keed_ind).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar11 = (local_178->orig_keed_ind).
                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1) {
        Vec<unsigned_int>::push_back_unique<unsigned_int&>
                  ((Vec<unsigned_int> *)&local_168,
                   (uint *)((ulong)*puVar11 * 4 +
                           *(long *)&(pTVar10->rcitem).
                                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ));
      }
      local_150.inst = pTVar10->inst;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_150.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                 &local_168);
      iVar5 = std::
              _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
              ::find(&local_60,(key_type *)&local_150);
      if (local_150.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_150.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((_Rb_tree_header *)iVar5._M_node == &local_60._M_impl.super__Rb_tree_header) {
        pIVar6 = pTVar10->inst;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f0,&local_168);
        pIVar6 = make_rewind_exec::anon_class_32_4_fc640c73::operator()
                           (&local_d8,pIVar6,(Vec<unsigned_int> *)&local_f0);
        if (local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        pIVar6 = *(Instruction **)(iVar5._M_node + 2);
      }
      Vec<Hpipe::Vec<Hpipe::Transition>>::secure_push_back<Hpipe::Instruction*>
                ((Vec<Hpipe::Vec<Hpipe::Transition>> *)&pIVar6->next_rw,uStack_170._4_4_,&local_178)
      ;
      pIVar3 = local_178;
      local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Transition::Transition(&local_150,pIVar6,&local_128,-1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar3->prev,
                 &local_150);
      if (local_150.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_150.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((InstructionMark *)pTVar10->inst == local_180) {
        Vec<unsigned_int>::uniqued((Vec<unsigned_int> *)&local_150,local_110);
        pIVar3 = local_150.inst;
        if ((long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
            (long)local_150.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)local_150.inst) {
          if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            bVar12 = true;
          }
          else {
            iVar4 = bcmp(local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_150.inst,
                         (long)local_168.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_168.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            bVar12 = iVar4 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (pIVar3 != (Instruction *)0x0) {
          operator_delete(pIVar3,(long)local_150.rcitem.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3);
        }
        if (bVar12) {
          rewind->exec = pIVar6;
        }
      }
      if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  p_Var8 = *(_Base_ptr *)
            ((long)&(local_180->super_Instruction).cx.paths_to_strings._M_t._M_impl.
                    super__Rb_tree_header._M_header + 0x10);
  p_Var9 = &(local_180->super_Instruction).cx.paths_to_strings._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var9) {
    do {
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
              ::find(&(rewind->super_Instruction).cx.paths_to_strings._M_t,(key_type *)(p_Var8 + 1))
      ;
      if ((_Rb_tree_header *)cVar7._M_node ==
          &(rewind->super_Instruction).cx.paths_to_strings._M_t._M_impl.super__Rb_tree_header) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &rewind->strs_to_cancel,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                  );
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var9);
  }
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::~_Deque_base(&local_b8);
  std::
  _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void InstructionGraph::make_rewind_exec( InstructionMark *mark, InstructionRewind *rewind ) {
    // we start from the end
    std::map<RewindContext,Instruction *> instruction_map; // [ orig, keep_ind ] => new instruction
    std::deque<PendingRewindTrans> pending_trans; //

    auto reg = [&]( Instruction *orig, Vec<unsigned> orig_keep_ind ) {
        Instruction *new_inst = orig->clone( inst_pool, orig->cx.keep_only( orig_keep_ind ).first.without_mark().first, orig_keep_ind );
        instruction_map[ RewindContext{ orig, orig_keep_ind } ] = new_inst;
        new_inst->running_strs = orig->running_strs;
        new_inst->orig_keed_ind = orig_keep_ind;
        new_inst->orig = orig;

        // look into prevs
        if ( orig != mark ) {
            std::set<Instruction *> prevs;
            for( unsigned num_prev = 0; num_prev < orig->prev.size(); ++num_prev ) {
                Instruction *prev = orig->prev[ num_prev ].inst;
                if ( prevs.count( prev ) )
                    continue;
                prevs.insert( prev );
                for( unsigned num_next = 0; num_next < prev->next.size(); ++num_next )
                    if ( prev->next[ num_next ].inst == orig )
                        pending_trans.emplace_back( new_inst, num_prev, num_next );
            }
        }

        return new_inst;
    };

    reg( rewind, range_vec( unsigned( rewind->cx.pos.size() ) ) );
    while ( ! pending_trans.empty() ) {
        PendingRewindTrans pt = pending_trans.back();
        pending_trans.pop_back();

        Vec<unsigned> keep_ind;
        Transition &t = pt.new_inst->orig->prev[ pt.num_prev ];
        for( unsigned keep_ind_next : pt.new_inst->orig_keed_ind )
            keep_ind.push_back_unique( t.rcitem[ keep_ind_next ] );

        // make the new instruction if not already done
        auto iter = instruction_map.find( RewindContext{ t.inst, keep_ind } );
        Instruction *new_inst = iter == instruction_map.end() ? reg( t.inst, keep_ind ) : iter->second;

        // std::cout << pt.new_inst->orig->get_display_id() << "\t->\t" << t.inst->get_display_id() << "\tki=[" << keep_ind << "]:\t" << new_inst->get_display_id() << "\t-> " << *new_inst << std::endl;

        // register in the graph
        new_inst->next_rw.secure_push_back( pt.num_next, pt.new_inst );
        pt.new_inst->prev << new_inst;

        //
        if ( t.inst == mark && keep_ind == rewind->cx.paths_to_mark.uniqued() )
            rewind->exec = new_inst;
    }

    // strings present in mark but not in rewind
    for( const auto &mp : mark->cx.paths_to_strings )
        if ( ! rewind->cx.paths_to_strings.count( mp.first ) )
            rewind->strs_to_cancel << mp.first;
}